

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_open_address_hash_dictionary_handler.c
# Opt level: O0

void test_open_address_dictionary_predicate_equality(planck_unit_test_t *tc)

{
  ion_boolean_t iVar1;
  planck_unit_result_t pVar2;
  undefined4 *key;
  ion_key_size_t extraout_EDX;
  ion_key_t pvVar3;
  undefined4 local_dc;
  undefined1 local_d8 [8];
  ion_predicate_t predicate;
  ion_dict_cursor_t cursor;
  ion_dictionary_t test_dictionary;
  ion_dictionary_handler_t map_handler;
  ion_record_info_t record;
  int size;
  ion_key_t key_under_test;
  planck_unit_test_t *tc_local;
  
  key = (undefined4 *)malloc(4);
  map_handler.close_dictionary._4_4_ = 4;
  createTestDictionary
            ((ion_dictionary_handler_t *)&test_dictionary.handler,
             (ion_record_info_t *)((long)&map_handler.close_dictionary + 4),10,
             (ion_dictionary_t *)&cursor.destroy,key_type_numeric_signed);
  cursor.next = oadict_destroy_cursor;
  local_dc = 1;
  dictionary_build_predicate((ion_predicate_t *)local_d8,'\0',&local_dc);
  cursor._0_8_ = &cursor.destroy;
  cursor.dictionary = (ion_dictionary_t *)local_d8;
  *key = 1;
  iVar1 = test_predicate((ion_dict_cursor_t *)&predicate.destroy,key);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\x01'),0x145,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  *key = 2;
  iVar1 = test_predicate((ion_dict_cursor_t *)&predicate.destroy,key);
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0x149,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  *key = 0xffffffff;
  iVar1 = test_predicate((ion_dict_cursor_t *)&predicate.destroy,key);
  pvVar3 = (ion_key_t)(ulong)(iVar1 == '\0');
  pVar2 = planck_unit_assert_true
                    (tc,(uint)(iVar1 == '\0'),0x14d,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/open_address_hash/test_open_address_hash_dictionary_handler.c"
                     ,"condition was false, expected true");
  if (pVar2 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  free(key);
  (*test_dictionary.instance[1].compare)(&cursor.destroy,pvVar3,extraout_EDX);
  return;
}

Assistant:

void
test_open_address_dictionary_predicate_equality(
	planck_unit_test_t *tc
) {
	ion_key_t key_under_test;

	key_under_test = malloc(sizeof(int));

	int					size;
	ion_record_info_t	record;

	/* this is required for initializing the hash map and should come from the dictionary */
	record.key_size		= sizeof(int);
	record.value_size	= 10;
	size				= 10;

	ion_dictionary_handler_t	map_handler;			/* create handler for hashmap */
	ion_dictionary_t			test_dictionary;		/* dictionary handler for test instance */

	createTestDictionary(&map_handler, &record, size, &test_dictionary, key_type_numeric_signed);

	ion_dict_cursor_t cursor;	/* create a new cursor */

	cursor.destroy = oadict_destroy_cursor;

	/* create a new predicate statement */
	ion_predicate_t predicate;

	dictionary_build_predicate(&predicate, predicate_equality, IONIZE(1, int));

	cursor.dictionary	= &test_dictionary;					/* register test dictionary */
	cursor.predicate	= &predicate;						/* register predicate */

	memcpy(key_under_test, &(int) { 1 }, sizeof(int));

	/* printf("key %i\n",*(int *)key_under_test); */

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_true == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(int) { 2 }, sizeof(int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_false == test_predicate(&cursor, key_under_test));

	memcpy(key_under_test, &(int) { -1 }, sizeof(int));

	PLANCK_UNIT_ASSERT_TRUE(tc, boolean_false == test_predicate(&cursor, key_under_test));

	free(key_under_test);

	/* destroy cursor for cleanup */
	/* cursor->destroy(&cursor); */
	/* and destroy the dictionary instance */
	test_dictionary.handler->delete_dictionary(&test_dictionary);
}